

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# game.cpp
# Opt level: O2

void __thiscall Game::Update(Game *this)

{
  Snake *this_00;
  undefined4 uVar1;
  undefined4 uVar2;
  int iVar3;
  int iVar4;
  undefined1 auVar5 [16];
  Snake local_a0;
  Snake local_60;
  
  if (((this->snake).alive == true) && ((this->snake2).alive == true)) {
    this_00 = &this->snake2;
    Snake::Snake(&local_60,this_00);
    Snake::Update(&this->snake,&local_60);
    std::_Vector_base<SDL_Point,_std::allocator<SDL_Point>_>::~_Vector_base
              (&local_60.body.super__Vector_base<SDL_Point,_std::allocator<SDL_Point>_>);
    Snake::Snake(&local_a0,&this->snake);
    Snake::Update(this_00,&local_a0);
    std::_Vector_base<SDL_Point,_std::allocator<SDL_Point>_>::~_Vector_base
              (&local_a0.body.super__Vector_base<SDL_Point,_std::allocator<SDL_Point>_>);
    iVar4 = (int)(this->snake).head_x;
    uVar1 = (this->snake2).head_x;
    uVar2 = (this->snake2).head_y;
    iVar3 = (this->food).x;
    if ((iVar3 == iVar4) && (iVar3 = iVar4, (this->food).y == (int)(this->snake).head_y)) {
      this->score = this->score + 1;
      PlaceFood(this);
      Snake::GrowBody(&this->snake);
      (this->snake).speed = (this->snake).speed + 0.02;
      iVar3 = (this->food).x;
    }
    iVar4 = (this->food).y;
    auVar5._0_4_ = -(uint)((int)(float)uVar1 == iVar3);
    auVar5._4_4_ = -(uint)((int)(float)uVar1 == iVar3);
    auVar5._8_4_ = -(uint)((int)(float)uVar2 == iVar4);
    auVar5._12_4_ = -(uint)((int)(float)uVar2 == iVar4);
    iVar3 = movmskpd(iVar3,auVar5);
    if (iVar3 == 3) {
      this->score = this->score + 1;
      PlaceFood(this);
      Snake::GrowBody(this_00);
      (this->snake2).speed = (this->snake2).speed + 0.02;
    }
  }
  return;
}

Assistant:

void Game::Update() {
  if (!snake.alive || !snake2.alive) return;


  snake.Update(snake2);
  snake2.Update(snake);


  int new_x = static_cast<int>(snake.head_x);
  int new_y = static_cast<int>(snake.head_y);

  int new_x_player2 = static_cast<int>(snake2.head_x);
  int new_y_player2 = static_cast<int>(snake2.head_y);
  
  // Check if there's food over here
  if (food.x == new_x && food.y == new_y) {
    score++;
    PlaceFood();
    // Grow snake and increase speed.
    snake.GrowBody();
    snake.speed += 0.02;
  }
  
  if(food.x == new_x_player2 && food.y == new_y_player2)
  {
    score++;
    PlaceFood();
    // Grow snake and increase speed.
    snake2.GrowBody();
    snake2.speed += 0.02; 
  }
  
}